

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::IsSpherical(ON_RevSurface *this,ON_Sphere *sphere,double tolerance)

{
  ON_Curve *this_00;
  double dVar1;
  bool bVar2;
  uint uVar3;
  ON_3dPoint *pOVar4;
  ON_3dVector local_220;
  ON_3dVector local_208;
  ON_3dPoint local_1f0;
  ON_3dVector local_1d8;
  ON_3dVector local_1c0;
  ON_3dVector local_1a8;
  ON_3dVector local_190;
  ON_Interval local_168;
  undefined1 auStack_158 [8];
  ON_3dPoint P;
  ON_Arc arc;
  ON_Plane plane;
  bool rc;
  double tolerance_local;
  ON_Sphere *sphere_local;
  ON_RevSurface *this_local;
  
  plane.plane_equation.d._7_1_ = 0;
  if (this->m_curve != (ON_Curve *)0x0) {
    ON_Plane::ON_Plane((ON_Plane *)(arc.m_angle.m_t + 1));
    ON_Arc::ON_Arc((ON_Arc *)&P.z);
    this_00 = this->m_curve;
    (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    dVar1 = ON_Interval::Mid(&local_168);
    ON_Curve::PointAt((ON_3dPoint *)auStack_158,this_00,dVar1);
    plane.origin.y = (this->m_axis).from.z;
    arc.m_angle.m_t[1] = (this->m_axis).from.x;
    plane.origin.x = (this->m_axis).from.y;
    ON_Line::Tangent(&local_190,&this->m_axis);
    plane.yaxis.y = local_190.z;
    plane.xaxis.z = local_190.x;
    plane.yaxis.x = local_190.y;
    ON_3dPoint::operator-(&local_1c0,(ON_3dPoint *)auStack_158,(ON_3dPoint *)(arc.m_angle.m_t + 1));
    ON_CrossProduct(&local_1a8,&local_1c0,(ON_3dVector *)&plane.xaxis.z);
    plane.zaxis.y = local_1a8.z;
    plane.yaxis.z = local_1a8.x;
    plane.zaxis.x = local_1a8.y;
    ON_3dVector::Unitize((ON_3dVector *)&plane.yaxis.z);
    ON_CrossProduct(&local_1d8,(ON_3dVector *)&plane.xaxis.z,(ON_3dVector *)&plane.yaxis.z);
    plane.xaxis.y = local_1d8.z;
    plane.origin.z = local_1d8.x;
    plane.xaxis.x = local_1d8.y;
    ON_Plane::UpdateEquation((ON_Plane *)(arc.m_angle.m_t + 1));
    bVar2 = ON_Plane::IsValid((ON_Plane *)(arc.m_angle.m_t + 1));
    if ((bVar2) &&
       (uVar3 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                          (SUB84(tolerance,0),this->m_curve,arc.m_angle.m_t + 1,&P.z),
       (uVar3 & 1) != 0)) {
      pOVar4 = ON_Circle::Center((ON_Circle *)&P.z);
      ON_Line::ClosestPointTo(&local_1f0,&this->m_axis,pOVar4);
      P.y = local_1f0.z;
      auStack_158 = (undefined1  [8])local_1f0.x;
      P.x = local_1f0.y;
      pOVar4 = ON_Circle::Center((ON_Circle *)&P.z);
      dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_158,pOVar4);
      if ((dVar1 <= tolerance) && (plane.plane_equation.d._7_1_ = 1, sphere != (ON_Sphere *)0x0)) {
        pOVar4 = ON_Circle::Center((ON_Circle *)&P.z);
        (sphere->plane).origin.z = pOVar4->z;
        dVar1 = pOVar4->y;
        (sphere->plane).origin.x = pOVar4->x;
        (sphere->plane).origin.y = dVar1;
        ON_Line::Tangent(&local_208,&this->m_axis);
        (sphere->plane).zaxis.z = local_208.z;
        (sphere->plane).zaxis.x = local_208.x;
        (sphere->plane).zaxis.y = local_208.y;
        (sphere->plane).yaxis.z = arc.super_ON_Circle.plane.zaxis.y;
        (sphere->plane).yaxis.x = arc.super_ON_Circle.plane.yaxis.z;
        (sphere->plane).yaxis.y = arc.super_ON_Circle.plane.zaxis.x;
        ON_CrossProduct(&local_220,&(sphere->plane).zaxis,&(sphere->plane).yaxis);
        (sphere->plane).xaxis.z = local_220.z;
        (sphere->plane).xaxis.x = local_220.x;
        (sphere->plane).xaxis.y = local_220.y;
        ON_Plane::UpdateEquation(&sphere->plane);
        sphere->radius = arc.super_ON_Circle.plane.plane_equation.d;
      }
    }
    ON_Arc::~ON_Arc((ON_Arc *)&P.z);
    ON_Plane::~ON_Plane((ON_Plane *)(arc.m_angle.m_t + 1));
  }
  return (bool)(plane.plane_equation.d._7_1_ & 1);
}

Assistant:

bool ON_RevSurface::IsSpherical(ON_Sphere* sphere, double tolerance ) const
{
  bool rc = false;
  if ( m_curve )
  {
    ON_Plane plane;
    ON_Arc arc;
    ON_3dPoint P = m_curve->PointAt( m_curve->Domain().Mid() );
    plane.origin = m_axis.from;
    plane.yaxis = m_axis.Tangent();
    plane.zaxis = ON_CrossProduct( P-plane.origin, plane.yaxis );
    plane.zaxis.Unitize();
    plane.xaxis = ON_CrossProduct( plane.yaxis, plane.zaxis );
    plane.UpdateEquation();
    if ( plane.IsValid() )
    {
      if ( m_curve->IsArc( &plane, &arc, tolerance ) )
      {
        P = m_axis.ClosestPointTo( arc.Center() );
        if ( P.DistanceTo(arc.Center()) <= tolerance )
        {
          rc = true;
          if ( sphere )
          {
            sphere->plane.origin = arc.Center();
            sphere->plane.zaxis = m_axis.Tangent();
            sphere->plane.yaxis = arc.plane.zaxis;
            sphere->plane.xaxis = ON_CrossProduct( sphere->plane.zaxis, sphere->plane.yaxis );
            sphere->plane.UpdateEquation();
            sphere->radius = arc.radius;
          }
        }
      }
    }
  }
  return rc;
}